

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O0

void __thiscall FatSystem::enableCache(FatSystem *this)

{
  uint uVar1;
  ostream *this_00;
  uint *puVar2;
  uint local_14;
  FatSystem *pFStack_10;
  int cluster;
  FatSystem *this_local;
  
  if ((this->cacheEnabled & 1U) == 0) {
    pFStack_10 = this;
    this_00 = std::operator<<((ostream *)&std::cout,"Computing FAT cache...");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    for (local_14 = 0; (ulong)(long)(int)local_14 < this->totalClusters; local_14 = local_14 + 1) {
      uVar1 = nextCluster(this,local_14,0);
      puVar2 = (uint *)std::
                       map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                       operator[](&this->cache,(key_type *)&local_14);
      *puVar2 = uVar1;
    }
    this->cacheEnabled = true;
  }
  return;
}

Assistant:

void FatSystem::enableCache()
{
    if (!cacheEnabled) {
        cout << "Computing FAT cache..." << endl;
        for (int cluster=0; cluster<totalClusters; cluster++) {
            cache[cluster] = nextCluster(cluster);
        }

        cacheEnabled = true;
    }
}